

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xpath.c
# Opt level: O1

int xpath_string_length(lyxp_set **args,uint16_t arg_count,lyd_node *cur_node,lys_module *param_4,
                       lyxp_set *set,int options)

{
  float fVar1;
  lyxp_set *plVar2;
  int iVar3;
  int iVar4;
  size_t sVar5;
  lys_node *plVar6;
  uint uVar7;
  char *pcVar8;
  long lVar9;
  ly_ctx *plVar10;
  lyd_node *plVar11;
  
  if ((options & 0x1cU) == 0) {
    if (arg_count == 0) {
      iVar3 = lyxp_set_cast(set,LYXP_SET_STRING,cur_node,param_4,options);
      if (iVar3 != 0) {
        return -1;
      }
      sVar5 = strlen((set->val).str);
    }
    else {
      iVar3 = lyxp_set_cast(*args,LYXP_SET_STRING,cur_node,param_4,options);
      if (iVar3 != 0) {
        return -1;
      }
      sVar5 = strlen(((*args)->val).str);
    }
    fVar1 = *(float *)(&DAT_001bbeb0 + (ulong)((long)sVar5 < 0) * 4);
    set_free_content(set);
    set->type = LYXP_SET_NUMBER;
    (set->val).num = (longdouble)(long)sVar5 + (longdouble)fVar1;
    return 0;
  }
  iVar3 = 0;
  if ((arg_count != 0) && (plVar2 = *args, iVar3 = 0, plVar2->type == LYXP_SET_SNODE_SET)) {
    uVar7 = plVar2->used;
    plVar11 = (lyd_node *)0x0;
    do {
      uVar7 = uVar7 - 1;
      if ((plVar2->val).nodes[uVar7].pos == 1) {
        plVar11 = (plVar2->val).nodes[uVar7].node;
        break;
      }
    } while (uVar7 != 0);
    iVar3 = 0;
    if (plVar11 != (lyd_node *)0x0) {
      if ((*(LYS_NODE *)&plVar11->ht & (LYS_LEAFLIST|LYS_LEAF)) == LYS_UNKNOWN) {
        plVar10 = param_4->ctx;
        plVar6 = (lys_node *)strnodetype(*(LYS_NODE *)&plVar11->ht);
        pcVar8 = "Argument #1 of %s is a %s node \"%s\".";
      }
      else {
        iVar4 = warn_is_string_type((lys_type *)&plVar11[1].ht);
        if (iVar4 != 0) goto LAB_00183694;
        plVar10 = param_4->ctx;
        plVar6 = plVar11->schema;
        pcVar8 = "Argument #1 of %s is node \"%s\", not of string-type.";
      }
      iVar3 = 1;
      ly_log(plVar10,LY_LLWRN,LY_SUCCESS,pcVar8,"xpath_string_length",plVar6);
    }
  }
LAB_00183694:
  if ((arg_count == 0) && (set->type == LYXP_SET_SNODE_SET)) {
    uVar7 = set->used;
    plVar11 = (lyd_node *)0x0;
    do {
      uVar7 = uVar7 - 1;
      if ((set->val).nodes[uVar7].pos == 1) {
        plVar11 = (set->val).nodes[uVar7].node;
        break;
      }
    } while (uVar7 != 0);
    if (plVar11 != (lyd_node *)0x0) {
      if ((*(LYS_NODE *)&plVar11->ht & (LYS_LEAFLIST|LYS_LEAF)) == LYS_UNKNOWN) {
        plVar10 = param_4->ctx;
        plVar6 = (lys_node *)strnodetype(*(LYS_NODE *)&plVar11->ht);
        pcVar8 = "Argument #0 of %s is a %s node \"%s\".";
      }
      else {
        iVar4 = warn_is_string_type((lys_type *)&plVar11[1].ht);
        if (iVar4 != 0) goto LAB_0018374a;
        plVar10 = param_4->ctx;
        plVar6 = plVar11->schema;
        pcVar8 = "Argument #0 of %s is node \"%s\", not of string-type.";
      }
      iVar3 = 1;
      ly_log(plVar10,LY_LLWRN,LY_SUCCESS,pcVar8,"xpath_string_length",plVar6);
    }
  }
LAB_0018374a:
  uVar7 = set->used;
  if ((ulong)uVar7 != 0) {
    lVar9 = 0;
    do {
      if (*(int *)((long)&((set->val).nodes)->pos + lVar9) == 1) {
        *(undefined4 *)((long)&((set->val).nodes)->pos + lVar9) = 0;
      }
      lVar9 = lVar9 + 0x10;
    } while ((ulong)uVar7 << 4 != lVar9);
  }
  return iVar3;
}

Assistant:

static int
xpath_string_length(struct lyxp_set **args, uint16_t arg_count, struct lyd_node *cur_node, struct lys_module *local_mod,
                    struct lyxp_set *set, int options)
{
    struct lys_node_leaf *sleaf;
    int ret = EXIT_SUCCESS;

    if (options & LYXP_SNODE_ALL) {
        if (arg_count && (args[0]->type == LYXP_SET_SNODE_SET) && (sleaf = (struct lys_node_leaf *)warn_get_snode_in_ctx(args[0]))) {
            if (!(sleaf->nodetype & (LYS_LEAF | LYS_LEAFLIST))) {
                LOGWRN(local_mod->ctx, "Argument #1 of %s is a %s node \"%s\".", __func__, strnodetype(sleaf->nodetype), sleaf->name);
                ret = EXIT_FAILURE;
            } else if (!warn_is_string_type(&sleaf->type)) {
                LOGWRN(local_mod->ctx, "Argument #1 of %s is node \"%s\", not of string-type.", __func__, sleaf->name);
                ret = EXIT_FAILURE;
            }
        }
        if (!arg_count && (set->type == LYXP_SET_SNODE_SET) && (sleaf = (struct lys_node_leaf *)warn_get_snode_in_ctx(set))) {
            if (!(sleaf->nodetype & (LYS_LEAF | LYS_LEAFLIST))) {
                LOGWRN(local_mod->ctx, "Argument #0 of %s is a %s node \"%s\".", __func__, strnodetype(sleaf->nodetype), sleaf->name);
                ret = EXIT_FAILURE;
            } else if (!warn_is_string_type(&sleaf->type)) {
                LOGWRN(local_mod->ctx, "Argument #0 of %s is node \"%s\", not of string-type.", __func__, sleaf->name);
                ret = EXIT_FAILURE;
            }
        }
        set_snode_clear_ctx(set);
        return ret;
    }

    if (arg_count) {
        if (lyxp_set_cast(args[0], LYXP_SET_STRING, cur_node, local_mod, options)) {
            return -1;
        }
        set_fill_number(set, strlen(args[0]->val.str));
    } else {
        if (lyxp_set_cast(set, LYXP_SET_STRING, cur_node, local_mod, options)) {
            return -1;
        }
        set_fill_number(set, strlen(set->val.str));
    }

    return EXIT_SUCCESS;
}